

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfcd.h
# Opt level: O0

UBool icu_63::CollationFCD::hasTccc(UChar32 c)

{
  bool local_11;
  int32_t i;
  UChar32 c_local;
  
  local_11 = false;
  if (0xbf < c) {
    local_11 = false;
    if ((byte)tcccIndex[c >> 5] != 0) {
      local_11 = (*(uint *)(tcccBits + (long)(int)(uint)(byte)tcccIndex[c >> 5] * 4) &
                 1 << ((byte)c & 0x1f)) != 0;
    }
  }
  return local_11;
}

Assistant:

static inline UBool hasTccc(UChar32 c) {
        // assert c <= 0xffff
        // c can be negative, e.g., U_SENTINEL from UCharIterator;
        // that is handled in the first test.
        int32_t i;
        return
            // U+00C0 is the first character with tccc!=0.
            c >= 0xc0 &&
            (i = tcccIndex[c >> 5]) != 0 &&
            (tcccBits[i] & ((uint32_t)1 << (c & 0x1f))) != 0;
    }